

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalExport,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>,unsigned_long&,duckdb::unique_ptr<duckdb::BoundExportData,std::default_delete<duckdb::BoundExportData>,true>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,CopyFunction *args_1,
          unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *args_2,
          unsigned_long *args_3,
          unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
          *args_4)

{
  pointer *pprVar1;
  idx_t estimated_cardinality;
  iterator __position;
  PhysicalExport *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundExportData_*,_false> local_318;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_310;
  idx_t *local_308;
  reference_wrapper<duckdb::PhysicalOperator> local_300;
  vector<duckdb::LogicalType,_true> local_2f8;
  CopyFunction local_2e0;
  
  local_308 = args_3;
  this_00 = (PhysicalExport *)ArenaAllocator::AllocateAligned(&this->arena,0x340);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f8,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  CopyFunction::CopyFunction(&local_2e0,args_1);
  local_310._M_head_impl =
       (args_2->super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
       super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl;
  (args_2->super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl = (CopyInfo *)0x0;
  estimated_cardinality = *local_308;
  local_318._M_head_impl =
       (args_4->
       super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
       .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl;
  (args_4->super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl = (BoundExportData *)0x0;
  PhysicalExport::PhysicalExport
            (this_00,&local_2f8,&local_2e0,
             (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)&local_310
             ,estimated_cardinality,
             (unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
              *)&local_318);
  if (local_318._M_head_impl != (BoundExportData *)0x0) {
    (*((local_318._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_318._M_head_impl = (BoundExportData *)0x0;
  if (local_310._M_head_impl != (CopyInfo *)0x0) {
    (*((local_310._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_310._M_head_impl = (CopyInfo *)0x0;
  local_2e0.super_Function._vptr_Function = (_func_int **)&PTR__CopyFunction_01966c38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.extension._M_dataplus._M_p != &local_2e0.extension.field_2) {
    operator_delete(local_2e0.extension._M_dataplus._M_p);
  }
  local_2e0.copy_from_function.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_01963be0;
  if (local_2e0.copy_from_function.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.copy_from_function.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_2e0.copy_from_function.super_SimpleNamedParameterFunction);
  Function::~Function(&local_2e0.super_Function);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f8);
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_300._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_300);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}